

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O0

void __thiscall dlib::file::file(file *this,string *name)

{
  EVP_PKEY_CTX *in_RSI;
  file *in_RDI;
  data *unaff_retaddr;
  
  data::data(unaff_retaddr);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

file (
            const std::string& name
        ) { init(name); }